

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.cpp
# Opt level: O2

SidTreeNode * __thiscall
COLLADASaxFWL::DocumentProcessor::resolveSidInInstance
          (DocumentProcessor *this,SidTreeNode *instancingElement,SidAddress *sidAddress,
          size_t firstSidIndex)

{
  Animatable *pAVar1;
  pointer pbVar2;
  pointer pbVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SidTreeNode *pSVar5;
  long lVar6;
  Animatable *pAVar7;
  size_t i;
  undefined1 local_b0 [104];
  size_t local_48;
  size_t sStack_40;
  
  if (instancingElement->mTargetType == TARGETTYPECLASS_INTERMEDIATETARGETABLE) {
    pAVar1 = (instancingElement->mTarget).animatable;
    iVar4 = (*pAVar1->_vptr_Animatable[2])(pAVar1);
    if (CONCAT44(extraout_var,iVar4) == 1) {
      iVar4 = (*pAVar1->_vptr_Animatable[2])(pAVar1);
      pAVar7 = (Animatable *)0x0;
      if (CONCAT44(extraout_var_00,iVar4) == 1) {
        pAVar7 = pAVar1;
      }
      SidAddress::SidAddress((SidAddress *)local_b0,(URI *)&pAVar7->mAnimationList);
      pbVar2 = (sidAddress->mSids).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = (sidAddress->mSids).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = firstSidIndex << 5;
      for (; firstSidIndex < (ulong)((long)pbVar2 - (long)pbVar3 >> 5);
          firstSidIndex = firstSidIndex + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_b0 + 0x28),
                    (value_type *)
                    ((long)&(((sidAddress->mSids).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6)
                   );
        lVar6 = lVar6 + 0x20;
      }
      local_48 = sidAddress->mFirstIndex;
      sStack_40 = sidAddress->mSecondIndex;
      local_b0._64_4_ = sidAddress->mMemberSelection;
      std::__cxx11::string::_M_assign((string *)(local_b0 + 0x48));
      pSVar5 = resolveSid(this,(SidAddress *)local_b0);
      SidAddress::~SidAddress((SidAddress *)local_b0);
      return pSVar5;
    }
  }
  return (SidTreeNode *)0x0;
}

Assistant:

const SidTreeNode* DocumentProcessor::resolveSidInInstance( const SidTreeNode* instancingElement, const SidAddress& sidAddress,  size_t firstSidIndex)
	{
		// the sid address we use to resolve the sid in the instantiated element
		const COLLADABU::URI* uri = 0;

		//check if instancingElement instantiates an element
		switch ( instancingElement->getTargetType() )
		{
		case SidTreeNode::TARGETTYPECLASS_INTERMEDIATETARGETABLE:
			{
				IntermediateTargetable* iTargetable = instancingElement->getIntermediateTargetableTarget();
				switch ( iTargetable->getClassId() )
				{
				case INTERMEDIATETARGETABLE_TYPE::KINEMATICS_INSTANCE:
					{
						KinematicInstance* ki = intermediateTargetableSafeCast<KinematicInstance>(iTargetable);
						uri = &ki->getUrl();
						break;
					}
				}

			}
			// 		case SidTreeNode::TARGETTYPECLASS_OBJECT:
			// 			{
			// 				COLLADAFW::Object* iObject = instancingElement->getObjectTarget();
			// 				switch ( iObject->getClassId() )
			// 				{
			// 				case COLLADAFW::COLLADA_TYPE::JOINT:
			// 					{
			// 						KinematicInstance* ki = (KinematicInstance*) iObject;
			// 						uri = &ki->getUrl();
			// 					}
			// 				}
			// 			}
        default:
            break;
		}

		if ( !uri )
		{
			// we could not find an instantiated element
			return 0;
		}

		SidAddress newSidAddress( *uri );
		const SidAddress::SidList& allSids = sidAddress.getSids();
		size_t allSidsCount = allSids.size();
		for ( size_t i = firstSidIndex; i < allSidsCount; ++i)
		{
			newSidAddress.appendSid( allSids[i] );
		}	
		newSidAddress.setFirstIndex( sidAddress.getFirstIndex() );
		newSidAddress.setSecondIndex( sidAddress.getSecondIndex() );
		newSidAddress.setMemberSelection( sidAddress.getMemberSelection() );
		newSidAddress.setMemberSelectionName( sidAddress.getMemberSelectionName() );
		return resolveSid( newSidAddress );
	}